

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

FBlockNode * FBlockNode::Create(AActor *who,int x,int y,int group)

{
  FBlockNode *local_28;
  FBlockNode *block;
  int group_local;
  int y_local;
  int x_local;
  AActor *who_local;
  
  if (FreeBlocks == (FBlockNode *)0x0) {
    local_28 = (FBlockNode *)operator_new(0x30);
  }
  else {
    local_28 = FreeBlocks;
    FreeBlocks = FreeBlocks->NextBlock;
  }
  local_28->BlockIndex = x + y * bmapwidth;
  local_28->Me = who;
  local_28->NextActor = (FBlockNode *)0x0;
  local_28->PrevActor = (FBlockNode **)0x0;
  local_28->PrevBlock = (FBlockNode **)0x0;
  local_28->NextBlock = (FBlockNode *)0x0;
  return local_28;
}

Assistant:

FBlockNode *FBlockNode::Create (AActor *who, int x, int y, int group)
{
	FBlockNode *block;

	if (FreeBlocks != NULL)
	{
		block = FreeBlocks;
		FreeBlocks = block->NextBlock;
	}
	else
	{
		block = new FBlockNode;
	}
	block->BlockIndex = x + y*bmapwidth;
	block->Me = who;
	block->NextActor = NULL;
	block->PrevActor = NULL;
	block->PrevBlock = NULL;
	block->NextBlock = NULL;
	return block;
}